

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

void __thiscall soplex::SPxSteepPR<double>::addedVecs(SPxSteepPR<double> *this,int n)

{
  SPxSolverBase<double> *pSVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  pdVar2 = (pSVar1->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = (pSVar1->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  VectorBase<double>::reDim(&pSVar1->weights,(pSVar1->thevectors->set).thenum,true);
  auVar6 = _DAT_005f4040;
  auVar5 = _DAT_005f4030;
  if (((this->super_SPxPricer<double>).thesolver)->theType == ENTER) {
    pdVar4 = (pSVar1->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar12 = (int)((ulong)((long)pdVar2 - (long)pdVar3) >> 3);
    iVar7 = (int)((ulong)((long)(pSVar1->weights).val.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar4) >> 3);
    if (iVar12 < iVar7) {
      lVar8 = (long)iVar12;
      lVar10 = iVar7 - lVar8;
      lVar11 = lVar10 + -1;
      auVar13._8_4_ = (int)lVar11;
      auVar13._0_8_ = lVar11;
      auVar13._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar9 = 0;
      auVar13 = auVar13 ^ _DAT_005f4040;
      do {
        auVar14._8_4_ = (int)uVar9;
        auVar14._0_8_ = uVar9;
        auVar14._12_4_ = (int)(uVar9 >> 0x20);
        auVar14 = (auVar14 | auVar5) ^ auVar6;
        if ((bool)(~(auVar14._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar14._0_4_ ||
                    auVar13._4_4_ < auVar14._4_4_) & 1)) {
          pdVar4[lVar8 + uVar9] = 2.0;
        }
        if ((auVar14._12_4_ != auVar13._12_4_ || auVar14._8_4_ <= auVar13._8_4_) &&
            auVar14._12_4_ <= auVar13._12_4_) {
          pdVar4[lVar8 + uVar9 + 1] = 2.0;
        }
        uVar9 = uVar9 + 2;
      } while ((lVar10 + 1U & 0xfffffffffffffffe) != uVar9);
    }
  }
  return;
}

Assistant:

void SPxSteepPR<R>::addedVecs(int n)
{
   VectorBase<R>& weights = this->thesolver->weights;
   n = weights.dim();
   weights.reDim(this->thesolver->coDim());

   if(this->thesolver->type() == SPxSolverBase<R>::ENTER)
   {
      for(; n < weights.dim(); ++n)
         weights[n] = 2;
   }
}